

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O0

void absl::RemoveExtraAsciiWhitespace(Nonnull<std::string_*> str)

{
  string_view str_00;
  bool bVar1;
  uchar *puVar2;
  uchar *puVar3;
  long lVar4;
  string *in_RDI;
  bool is_ws;
  value_type *output_it;
  const_iterator input_end;
  const_iterator input_it;
  string_view stripped;
  bool local_41;
  uchar *local_40;
  size_t in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  string_view local_18;
  string *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
  str_00._M_str = in_stack_ffffffffffffffd0;
  str_00._M_len = in_stack_ffffffffffffffc8;
  local_18 = StripAsciiWhitespace(str_00);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (bVar1) {
    std::__cxx11::string::clear();
  }
  else {
    puVar2 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_18);
    puVar3 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::end(&local_18);
    local_40 = (uchar *)std::__cxx11::string::operator[]((ulong)local_8);
    local_41 = false;
    for (; puVar2 < puVar3; puVar2 = puVar2 + 1) {
      if (local_41 == false) {
        local_41 = ascii_isspace(*puVar2);
      }
      else {
        local_41 = ascii_isspace(*puVar2);
        if (local_41) {
          local_40 = local_40 + -1;
        }
      }
      *local_40 = *puVar2;
      local_40 = local_40 + 1;
    }
    lVar4 = std::__cxx11::string::operator[]((ulong)local_8);
    std::__cxx11::string::erase((ulong)local_8,(long)local_40 - lVar4);
  }
  return;
}

Assistant:

void RemoveExtraAsciiWhitespace(absl::Nonnull<std::string*> str) {
  auto stripped = StripAsciiWhitespace(*str);

  if (stripped.empty()) {
    str->clear();
    return;
  }

  auto input_it = stripped.begin();
  auto input_end = stripped.end();
  auto output_it = &(*str)[0];
  bool is_ws = false;

  for (; input_it < input_end; ++input_it) {
    if (is_ws) {
      // Consecutive whitespace?  Keep only the last.
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
      if (is_ws) --output_it;
    } else {
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
    }

    *output_it = *input_it;
    ++output_it;
  }

  str->erase(static_cast<size_t>(output_it - &(*str)[0]));
}